

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::setupUniformData
          (ShaderRenderCaseInstance *this,deUint32 bindingLocation,size_t size,void *dataPtr)

{
  Allocator *pAVar1;
  Allocation *ptr;
  BufferUniform *pBVar2;
  VkResult result;
  VkDevice device;
  DeviceInterface *vk;
  Unique<vk::Handle<(vk::HandleType)8>_> *ptr_00;
  UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  *ptr_01;
  SharedPtr<vk::Allocation> SStack_d8;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  MovePtr<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
  uniformInfo;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  deUint32 queueFamilyIndex;
  VkBufferCreateInfo uniformBufferParams;
  
  device = getDevice(this);
  vk = getDeviceInterface(this);
  queueFamilyIndex = getUniversalQueueFamilyIndex(this);
  uniformBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  uniformBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  uniformBufferParams.pNext = (void *)0x0;
  uniformBufferParams.flags = 0;
  uniformBufferParams.usage = 0x10;
  uniformBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  uniformBufferParams.queueFamilyIndexCount = 1;
  uniformBufferParams.size = size;
  ::vk::createBuffer(&buffer,vk,device,&uniformBufferParams,(VkAllocationCallbacks *)0x0);
  pAVar1 = this->m_memAlloc;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&uniformInfo,vk,device,
             (VkBuffer)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
            );
  (*pAVar1->_vptr_Allocator[3])(&alloc,pAVar1,&uniformInfo,1);
  result = (*vk->_vptr_DeviceInterface[0xc])
                     (vk,device,
                      buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                      ((alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                        m_data.ptr)->m_memory).m_internal,
                      (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                       m_data.ptr)->m_offset);
  ::vk::checkResult(result,
                    "vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                    ,0x32b);
  memcpy((alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,dataPtr,size);
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
              ptr)->m_memory).m_internal,
             (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
             )->m_offset,size);
  uniformInfo.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
  .m_data.ptr = (BufferUniform *)operator_new(0x48);
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->super_UniformInfo)._vptr_UniformInfo = (_func_int **)&PTR__BufferUniform_00bd37b0;
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->buffer).m_ptr = (Unique<vk::Handle<(vk::HandleType)8>_> *)0x0;
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->buffer).m_state = (SharedPtrStateBase *)0x0;
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->alloc).m_ptr = (Allocation *)0x0;
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->alloc).m_state = (SharedPtrStateBase *)0x0;
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->super_UniformInfo).type = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->descriptor).buffer.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->descriptor).offset = 0;
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->descriptor).range = size;
  ((uniformInfo.
    super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
    .m_data.ptr)->super_UniformInfo).location = bindingLocation;
  ptr_00 = (Unique<vk::Handle<(vk::HandleType)8>_> *)operator_new(0x20);
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_device =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_allocator =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  (ptr_00->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.deleter.m_deviceIface =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::SharedPtr
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&SStack_d8,ptr_00
            );
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::operator=
            (&(uniformInfo.
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
               .m_data.ptr)->buffer,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&SStack_d8);
  de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_>::~SharedPtr
            ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&SStack_d8);
  ptr = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  de::SharedPtr<vk::Allocation>::SharedPtr(&SStack_d8,ptr);
  de::SharedPtr<vk::Allocation>::operator=
            (&(uniformInfo.
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
               .m_data.ptr)->alloc,&SStack_d8);
  de::SharedPtr<vk::Allocation>::release(&SStack_d8);
  ptr_01 = (UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
            *)operator_new(0x10);
  pBVar2 = uniformInfo.
           super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
           .m_data.ptr;
  uniformInfo.
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
  .m_data.ptr = (BufferUniform *)0x0;
  (ptr_01->
  super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>
  ).m_data.ptr = &pBVar2->super_UniformInfo;
  de::
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  ::SharedPtr((SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
               *)&SStack_d8,ptr_01);
  std::
  vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
  ::
  emplace_back<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>
            ((vector<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>,std::allocator<de::SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>>>>>
              *)&this->m_uniformInfos,
             (SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
              *)&SStack_d8);
  de::
  SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
  ::release((SharedPtr<de::details::UniquePtr<vkt::sr::ShaderRenderCaseInstance::UniformInfo,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::UniformInfo>_>_>
             *)&SStack_d8);
  de::details::
  UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
  ::~UniqueBase(&uniformInfo.
                 super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::BufferUniform,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::BufferUniform>_>
               );
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  return;
}

Assistant:

void ShaderRenderCaseInstance::setupUniformData (deUint32 bindingLocation, size_t size, const void* dataPtr)
{
	const VkDevice					vkDevice			= getDevice();
	const DeviceInterface&			vk					= getDeviceInterface();
	const deUint32					queueFamilyIndex	= getUniversalQueueFamilyIndex();

	const VkBufferCreateInfo		uniformBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		size,										// VkDeviceSize			size;
		VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		1u,											// deUint32				queueFamilyCount;
		&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>					buffer				= createBuffer(vk, vkDevice, &uniformBufferParams);
	de::MovePtr<Allocation>			alloc				= m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, alloc->getMemory(), alloc->getOffset()));

	deMemcpy(alloc->getHostPtr(), dataPtr, size);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), size);

	de::MovePtr<BufferUniform> uniformInfo(new BufferUniform());
	uniformInfo->type = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
	uniformInfo->descriptor = makeDescriptorBufferInfo(*buffer, 0u, size);
	uniformInfo->location = bindingLocation;
	uniformInfo->buffer = VkBufferSp(new vk::Unique<VkBuffer>(buffer));
	uniformInfo->alloc = AllocationSp(alloc.release());

	m_uniformInfos.push_back(UniformInfoSp(new de::UniquePtr<UniformInfo>(uniformInfo)));
}